

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ConvertToSampledImagePass::GetDescriptorSetBinding
          (ConvertToSampledImagePass *this,Instruction *inst,
          DescriptorSetAndBinding *descriptor_set_binding)

{
  Instruction *this_00;
  uint __line;
  uint32_t uVar1;
  DecorationManager *this_01;
  pointer ppIVar2;
  bool bVar3;
  bool bVar4;
  char *__assertion;
  bool bVar5;
  bool bVar6;
  DescriptorSetAndBinding *pDVar7;
  _Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_48
  ;
  
  this_01 = IRContext::get_decoration_mgr((this->super_Pass).context_);
  uVar1 = Instruction::result_id(inst);
  bVar5 = false;
  analysis::DecorationManager::GetDecorationsFor
            ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &local_48,this_01,uVar1,false);
  bVar3 = false;
  ppIVar2 = local_48._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppIVar2 == local_48._M_impl.super__Vector_impl_data._M_finish) {
      std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
      ::~_Vector_base(&local_48);
      return (bool)(bVar3 & bVar5);
    }
    this_00 = *ppIVar2;
    uVar1 = Instruction::GetSingleWordInOperand(this_00,1);
    if (uVar1 == 0x21) {
      bVar6 = true;
      pDVar7 = (DescriptorSetAndBinding *)&descriptor_set_binding->binding;
      bVar4 = bVar3;
      if (bVar5) {
        __assertion = "false && \"A resource has two OpDecorate for the binding\"";
        __line = 0x65;
LAB_004cbd66:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/convert_to_sampled_image_pass.cpp"
                      ,__line,
                      "bool spvtools::opt::ConvertToSampledImagePass::GetDescriptorSetBinding(const Instruction &, DescriptorSetAndBinding *) const"
                     );
      }
LAB_004cbd00:
      uVar1 = Instruction::GetSingleWordInOperand(this_00,2);
      pDVar7->descriptor_set = uVar1;
      bVar3 = bVar4;
      bVar5 = bVar6;
    }
    else if (uVar1 == 0x22) {
      pDVar7 = descriptor_set_binding;
      bVar4 = true;
      bVar6 = bVar5;
      if (bVar3) {
        __assertion = "false && \"A resource has two OpDecorate for the descriptor set\"";
        __line = 0x5d;
        goto LAB_004cbd66;
      }
      goto LAB_004cbd00;
    }
    ppIVar2 = ppIVar2 + 1;
  } while( true );
}

Assistant:

bool ConvertToSampledImagePass::GetDescriptorSetBinding(
    const Instruction& inst,
    DescriptorSetAndBinding* descriptor_set_binding) const {
  auto* decoration_manager = context()->get_decoration_mgr();
  bool found_descriptor_set_to_convert = false;
  bool found_binding_to_convert = false;
  for (auto decorate :
       decoration_manager->GetDecorationsFor(inst.result_id(), false)) {
    spv::Decoration decoration =
        spv::Decoration(decorate->GetSingleWordInOperand(1u));
    if (decoration == spv::Decoration::DescriptorSet) {
      if (found_descriptor_set_to_convert) {
        assert(false && "A resource has two OpDecorate for the descriptor set");
        return false;
      }
      descriptor_set_binding->descriptor_set =
          decorate->GetSingleWordInOperand(2u);
      found_descriptor_set_to_convert = true;
    } else if (decoration == spv::Decoration::Binding) {
      if (found_binding_to_convert) {
        assert(false && "A resource has two OpDecorate for the binding");
        return false;
      }
      descriptor_set_binding->binding = decorate->GetSingleWordInOperand(2u);
      found_binding_to_convert = true;
    }
  }
  return found_descriptor_set_to_convert && found_binding_to_convert;
}